

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

_Bool fy_node_uses_single_input_only(fy_node *fyn,fy_input *fyi)

{
  byte bVar1;
  _Bool _Var2;
  fy_input *pfVar3;
  fy_node_pair *local_30;
  fy_node_pair *fynp;
  fy_node *fyni;
  fy_input *fyi_local;
  fy_node *fyn_local;
  
  if ((fyn == (fy_node *)0x0) || (fyi == (fy_input *)0x0)) {
    fyn_local._7_1_ = false;
  }
  else {
    bVar1 = fyn->field_0x34 & 3;
    if ((fyn->field_0x34 & 3) == 0) {
      pfVar3 = fy_token_get_input((fyn->field_12).scalar);
      fyn_local._7_1_ = pfVar3 == fyi;
    }
    else {
      if (bVar1 == 1) {
        pfVar3 = fy_token_get_input((fyn->field_13).sequence_start);
        if (pfVar3 != fyi) {
          return false;
        }
        for (fynp = (fy_node_pair *)fy_node_list_head(&(fyn->field_12).sequence);
            fynp != (fy_node_pair *)0x0;
            fynp = (fy_node_pair *)fy_node_next(&(fyn->field_12).sequence,(fy_node *)fynp)) {
          _Var2 = fy_node_uses_single_input_only((fy_node *)fynp,fyi);
          if (!_Var2) {
            return false;
          }
        }
        pfVar3 = fy_token_get_input((fyn->field_14).sequence_end);
        if (pfVar3 != fyi) {
          return false;
        }
      }
      else if (bVar1 == 2) {
        pfVar3 = fy_token_get_input((fyn->field_13).sequence_start);
        if (pfVar3 != fyi) {
          return false;
        }
        for (local_30 = fy_node_pair_list_head(&(fyn->field_12).mapping);
            local_30 != (fy_node_pair *)0x0;
            local_30 = fy_node_pair_next(&(fyn->field_12).mapping,local_30)) {
          if ((local_30->key != (fy_node *)0x0) &&
             (_Var2 = fy_node_uses_single_input_only(local_30->key,fyi), !_Var2)) {
            return false;
          }
          if ((local_30->value != (fy_node *)0x0) &&
             (_Var2 = fy_node_uses_single_input_only(local_30->value,fyi), !_Var2)) {
            return false;
          }
        }
        pfVar3 = fy_token_get_input((fyn->field_14).sequence_end);
        if (pfVar3 != fyi) {
          return false;
        }
      }
      fyn_local._7_1_ = true;
    }
  }
  return fyn_local._7_1_;
}

Assistant:

bool fy_node_uses_single_input_only(struct fy_node *fyn, struct fy_input *fyi) {
    struct fy_node *fyni;
    struct fy_node_pair *fynp;

    if (!fyn || !fyi)
        return false;

    switch (fyn->type) {
        case FYNT_SCALAR:
            return fy_token_get_input(fyn->scalar) == fyi;

        case FYNT_SEQUENCE:
            if (fy_token_get_input(fyn->sequence_start) != fyi)
                return false;

            for (fyni = fy_node_list_head(&fyn->sequence); fyni;
                 fyni = fy_node_next(&fyn->sequence, fyni)) {

                if (!fy_node_uses_single_input_only(fyni, fyi))
                    return false;
            }

            if (fy_token_get_input(fyn->sequence_end) != fyi)
                return false;
            break;

        case FYNT_MAPPING:
            if (fy_token_get_input(fyn->mapping_start) != fyi)
                return false;

            for (fynp = fy_node_pair_list_head(&fyn->mapping); fynp;
                 fynp = fy_node_pair_next(&fyn->mapping, fynp)) {

                if (fynp->key && !fy_node_uses_single_input_only(fynp->key, fyi))
                    return false;

                if (fynp->value && !fy_node_uses_single_input_only(fynp->value, fyi))
                    return false;
            }

            if (fy_token_get_input(fyn->mapping_end) != fyi)
                return false;

            break;
    }

    return true;
}